

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O2

QPalette * __thiscall QKdeTheme::palette(QKdeTheme *this,Palette type)

{
  int iVar1;
  QPlatformThemePrivate *pQVar2;
  QDebug *pQVar3;
  QPalette *pQVar4;
  long in_FS_OFFSET;
  QDebug local_60;
  QDebug local_58;
  undefined1 local_50 [8];
  QDebug local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGenericUnixTheme).super_QPlatformTheme.d_ptr.d;
  iVar1 = *(int *)((long)&pQVar2[5].systemPalette + 4);
  if ((iVar1 == 0) || (iVar1 == *(int *)&pQVar2[5].systemPalette)) {
    pQVar4 = (QPalette *)pQVar2[5].name.d.d;
  }
  else {
    lcQpaThemeKde();
    if (((byte)lcQpaThemeKde::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      QMessageLogger::debug();
      pQVar3 = QDebug::operator<<(&local_60,
                                  "Current KDE theme doesn\'t support reuqested color scheme");
      local_58.stream = pQVar3->stream;
      (local_58.stream)->ref = (local_58.stream)->ref + 1;
      ::operator<<((Stream *)local_50,(ColorScheme)&local_58);
      pQVar3 = QDebug::operator<<((QDebug *)local_50,"Falling back to fusion palette:");
      local_48.stream = pQVar3->stream;
      (local_48.stream)->ref = (local_48.stream)->ref + 1;
      ::operator<<((Stream *)local_40,(Palette)&local_48);
      QDebug::~QDebug((QDebug *)local_40);
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
    }
    pQVar4 = QPlatformTheme::palette((QPlatformTheme *)this,type);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

const QPalette *QKdeTheme::palette(Palette type) const
{
    Q_D(const QKdeTheme);
    if (d->hasRequestedColorScheme()) {
        qCDebug(lcQpaThemeKde) << "Current KDE theme doesn't support reuqested color scheme"
                               << d->m_requestedColorScheme << "Falling back to fusion palette:"
                               << type;
        return QPlatformTheme::palette(type);
    }

    return d->systemPalette.get();
}